

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O0

spv_result_t
spvtools::anon_unknown_0::spvTextParseMaskOperand
          (spv_target_env env,spv_operand_table operandTable,spv_operand_type_t type,char *textValue
          ,uint32_t *pValue)

{
  spv_result_t sVar1;
  spv_operand_desc psStack_60;
  spv_result_t error;
  spv_operand_desc entry;
  char *end;
  char *begin;
  uint32_t value;
  char separator;
  char *text_end;
  size_t text_length;
  uint32_t *pValue_local;
  char *textValue_local;
  spv_operand_table psStack_18;
  spv_operand_type_t type_local;
  spv_operand_table operandTable_local;
  spv_target_env env_local;
  
  if (textValue == (char *)0x0) {
    operandTable_local._4_4_ = SPV_ERROR_INVALID_TEXT;
  }
  else {
    text_length = (size_t)pValue;
    pValue_local = (uint32_t *)textValue;
    textValue_local._4_4_ = type;
    psStack_18 = operandTable;
    operandTable_local._0_4_ = env;
    text_end = (char *)strlen(textValue);
    if (text_end == (char *)0x0) {
      operandTable_local._4_4_ = SPV_ERROR_INVALID_TEXT;
    }
    else {
      _value = (spv_operand_desc)((long)pValue_local + (long)text_end);
      begin._7_1_ = 0x7c;
      begin._0_4_ = 0;
      end = (char *)pValue_local;
      entry = (spv_operand_desc)0x0;
      do {
        entry = (spv_operand_desc)
                std::find<char_const*,char>(end,(char *)_value,(char *)((long)&begin + 7));
        psStack_60 = (spv_operand_desc)0x0;
        sVar1 = spvOperandTableNameLookup
                          ((spv_target_env)operandTable_local,psStack_18,textValue_local._4_4_,end,
                           (long)entry - (long)end,&stack0xffffffffffffffa0);
        if (sVar1 != SPV_SUCCESS) {
          return sVar1;
        }
        begin._0_4_ = psStack_60->value | (uint)begin;
        end = (char *)((long)&entry->name + 1);
      } while (entry != _value);
      *(uint *)text_length = (uint)begin;
      operandTable_local._4_4_ = SPV_SUCCESS;
    }
  }
  return operandTable_local._4_4_;
}

Assistant:

spv_result_t spvTextParseMaskOperand(spv_target_env env,
                                     const spv_operand_table operandTable,
                                     const spv_operand_type_t type,
                                     const char* textValue, uint32_t* pValue) {
  if (textValue == nullptr) return SPV_ERROR_INVALID_TEXT;
  size_t text_length = strlen(textValue);
  if (text_length == 0) return SPV_ERROR_INVALID_TEXT;
  const char* text_end = textValue + text_length;

  // We only support mask expressions in ASCII, so the separator value is a
  // char.
  const char separator = '|';

  // Accumulate the result by interpreting one word at a time, scanning
  // from left to right.
  uint32_t value = 0;
  const char* begin = textValue;  // The left end of the current word.
  const char* end = nullptr;  // One character past the end of the current word.
  do {
    end = std::find(begin, text_end, separator);

    spv_operand_desc entry = nullptr;
    if (auto error = spvOperandTableNameLookup(env, operandTable, type, begin,
                                               end - begin, &entry)) {
      return error;
    }
    value |= entry->value;

    // Advance to the next word by skipping over the separator.
    begin = end + 1;
  } while (end != text_end);

  *pValue = value;
  return SPV_SUCCESS;
}